

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

void __thiscall tcu::Matrix<double,_3,_2>::Matrix(Matrix<double,_3,_2> *this,double *src)

{
  double dVar1;
  double *pdVar2;
  int local_20;
  int local_1c;
  int col;
  int row;
  double *src_local;
  Matrix<double,_3,_2> *this_local;
  
  Vector<tcu::Vector<double,_3>,_2>::Vector(&this->m_data);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      dVar1 = src[local_1c * 2 + local_20];
      pdVar2 = operator()(this,local_1c,local_20);
      *pdVar2 = dVar1;
    }
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}